

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version.cpp
# Opt level: O1

uint ON::VersionGetQuartet(uint *opennurbs_version_quartet)

{
  if (opennurbs_version_quartet != (uint *)0x0) {
    opennurbs_version_quartet[0] = 8;
    opennurbs_version_quartet[1] = 0x11;
    opennurbs_version_quartet[2] = 0x61ea;
    opennurbs_version_quartet[3] = 7000;
  }
  return 0x90449064;
}

Assistant:

unsigned int ON::VersionGetQuartet(
  unsigned int opennurbs_version_quartet[4]
  )
{
  const unsigned int v[4] = {OPENNURBS_VERSION_QUARTET_WITH_COMMAS};
  if ( opennurbs_version_quartet )
  {
    opennurbs_version_quartet[0] = v[0];
    opennurbs_version_quartet[1] = v[1];
    opennurbs_version_quartet[2] = v[2];
    opennurbs_version_quartet[3] = v[3];
  }
  return OPENNURBS_VERSION_NUMBER;
}